

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

void S_PrecacheLevel(void)

{
  ushort *puVar1;
  FSoundChan *pFVar2;
  uint uVar3;
  long lVar4;
  DThinker *pDVar5;
  ulong uVar6;
  FSoundChan **ppFVar7;
  TThinkerIterator<AActor> iterator;
  
  if (GSnd != (SoundRenderer *)0x0) {
    lVar4 = 0x30;
    for (uVar6 = 0; uVar6 < S_sfx.Count; uVar6 = uVar6 + 1) {
      puVar1 = (ushort *)((long)&((S_sfx.Array)->data).data + lVar4);
      *puVar1 = *puVar1 & 0xffdf;
      lVar4 = lVar4 + 0x50;
    }
    TThinkerIterator<AActor>::TThinkerIterator(&iterator,0x80);
    while (pDVar5 = FThinkerIterator::Next(&iterator.super_FThinkerIterator,false),
          pDVar5 != (DThinker *)0x0) {
      (*(pDVar5->super_DObject)._vptr_DObject[0xc])(pDVar5);
    }
    lVar4 = 0;
    for (uVar6 = 0; uVar6 < ((level.info)->PrecacheSounds).Count; uVar6 = uVar6 + 1) {
      FSoundID::MarkUsed((FSoundID *)((long)&(((level.info)->PrecacheSounds).Array)->ID + lVar4));
      lVar4 = lVar4 + 4;
    }
    ppFVar7 = &Channels;
    while (pFVar2 = *ppFVar7, pFVar2 != (FSoundChan *)0x0) {
      FSoundID::MarkUsed(&pFVar2->SoundID);
      ppFVar7 = &pFVar2->NextChan;
    }
    lVar4 = 0x50;
    uVar3 = S_sfx.Count;
    for (uVar6 = 1; uVar6 < uVar3; uVar6 = uVar6 + 1) {
      if (((&(S_sfx.Array)->field_0x30)[lVar4] & 0x20) != 0) {
        S_CacheSound((sfxinfo_t *)((long)&((S_sfx.Array)->data).data + lVar4));
        uVar3 = S_sfx.Count;
      }
      lVar4 = lVar4 + 0x50;
    }
    lVar4 = 0x50;
    for (uVar6 = 1; uVar6 < uVar3; uVar6 = uVar6 + 1) {
      if ((((&(S_sfx.Array)->field_0x30)[lVar4] & 0x20) == 0) &&
         (*(int *)((long)&(S_sfx.Array)->link + lVar4) == -1)) {
        S_UnloadSound((sfxinfo_t *)((long)&((S_sfx.Array)->data).data + lVar4));
        uVar3 = S_sfx.Count;
      }
      lVar4 = lVar4 + 0x50;
    }
  }
  return;
}

Assistant:

void S_PrecacheLevel ()
{
	unsigned int i;

	if (GSnd)
	{
		for (i = 0; i < S_sfx.Size(); ++i)
		{
			S_sfx[i].bUsed = false;
		}

		AActor *actor;
		TThinkerIterator<AActor> iterator;

		// Precache all sounds known to be used by the currently spawned actors.
		while ( (actor = iterator.Next()) != NULL )
		{
			actor->MarkPrecacheSounds();
		}
		// Precache all extra sounds requested by this map.
		for (i = 0; i < level.info->PrecacheSounds.Size(); ++i)
		{
			level.info->PrecacheSounds[i].MarkUsed();
		}
		// Don't unload sounds that are playing right now.
		for (FSoundChan *chan = Channels; chan != NULL; chan = chan->NextChan)
		{
			chan->SoundID.MarkUsed();
		}

		for (i = 1; i < S_sfx.Size(); ++i)
		{
			if (S_sfx[i].bUsed)
			{
				S_CacheSound (&S_sfx[i]);
			}
		}
		for (i = 1; i < S_sfx.Size(); ++i)
		{
			if (!S_sfx[i].bUsed && S_sfx[i].link == sfxinfo_t::NO_LINK)
			{
				S_UnloadSound (&S_sfx[i]);
			}
		}
	}
}